

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  pointer pEVar1;
  uint uVar2;
  char edit;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t *psVar8;
  long lVar9;
  bool bVar10;
  stringstream local_270 [8];
  stringstream ss;
  ostream local_260 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  undefined1 local_e0 [8];
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_e8 = right;
  CalculateOptimalEdits
            ((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              *)&hunk.hunk_removes_.
                 super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                 ._M_impl._M_node._M_size,left,right);
  std::__cxx11::stringstream::stringstream(local_270);
  local_40 = 0;
  local_38 = 0;
  local_48 = 0;
  do {
    uVar6 = (long)((long)edits.
                         super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                  hunk.hunk_removes_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size) >> 2;
    if (uVar6 <= local_38) {
LAB_0012a0fa:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_270);
      std::
      _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ::~_Vector_base((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       *)&hunk.hunk_removes_.
                          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                          ._M_impl._M_node._M_size);
      return __return_storage_ptr__;
    }
    lVar9 = local_40 << 5;
    uVar3 = local_40;
    for (lVar5 = 0; uVar6 - local_38 != lVar5; lVar5 = lVar5 + 1) {
      if (*(int *)(hunk.hunk_removes_.
                   super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   ._M_impl._M_node._M_size + local_38 * 4 + lVar5 * 4) != 0) {
        uVar6 = local_38 + lVar5;
        break;
      }
      uVar3 = uVar3 + 1;
      lVar9 = lVar9 + 0x20;
    }
    local_38 = uVar6;
    local_40 = local_40 + lVar5;
    sVar7 = context;
    if (local_40 < context) {
      sVar7 = local_40;
    }
    if (context < uVar3) {
      uVar3 = context;
    }
    local_48 = local_48 + lVar5;
    local_e0 = (undefined1  [8])(local_40 + (1 - uVar3));
    hunk.left_start_ = (1 - uVar3) + local_48;
    hunk.right_start_ = 0;
    hunk.adds_ = 0;
    hunk.removes_ = 0;
    hunk.common_ = (size_t)&hunk.common_;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    lVar9 = lVar9 + uVar3 * -0x20;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_adds_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)hunk.common_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    while (bVar10 = sVar7 != 0, sVar7 = sVar7 - 1, bVar10) {
      anon_unknown_1::Hunk::PushLine
                ((Hunk *)local_e0,' ',
                 *(char **)((long)&(((left->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar9));
      lVar9 = lVar9 + 0x20;
    }
    lVar5 = local_38 * 4;
    uVar6 = 0;
    for (; local_38 <
           (ulong)((long)((long)edits.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                         hunk.hunk_removes_.
                         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                         ._M_impl._M_node._M_size) >> 2); local_38 = local_38 + 1) {
      lVar9 = lVar5;
      if (context <= uVar6) {
        while( true ) {
          pEVar1 = (pointer)(hunk.hunk_removes_.
                             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                             ._M_impl._M_node._M_size + lVar9);
          if (pEVar1 == edits.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_start) goto LAB_00129f7c;
          if (*pEVar1 != kMatch) break;
          lVar9 = lVar9 + 4;
        }
        if ((pEVar1 == edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start) ||
           (context <= (lVar9 >> 2) - local_38)) break;
      }
      uVar2 = *(uint *)(hunk.hunk_removes_.
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node._M_size + local_38 * 4);
      uVar6 = uVar6 + 1;
      if (uVar2 != 0) {
        uVar6 = 0;
      }
      if ((uVar2 < 4) && (uVar2 != 1)) {
        edit = '-';
        if (uVar2 == 0) {
          edit = ' ';
        }
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)local_e0,edit,
                   (left->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_40]._M_dataplus._M_p);
      }
      if ((uVar2 & 0xfffffffd) == 1) {
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)local_e0,'+',
                   (local_e8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_48]._M_dataplus._M_p);
      }
      local_40 = local_40 + (uVar2 != 1);
      local_48 = local_48 + (ulong)(uVar2 != 2);
      lVar5 = lVar5 + 4;
    }
LAB_00129f7c:
    if (hunk.adds_ == 0 && hunk.right_start_ == 0) {
      anon_unknown_1::Hunk::~Hunk((Hunk *)local_e0);
      goto LAB_0012a0fa;
    }
    std::operator<<(local_260,"@@ ");
    if (hunk.adds_ != 0) {
      poVar4 = std::operator<<(local_260,"-");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      if (hunk.right_start_ != 0 && hunk.adds_ != 0) {
        std::operator<<(local_260," ");
      }
    }
    if (hunk.right_start_ != 0) {
      poVar4 = std::operator<<(local_260,"+");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<(local_260," @@\n");
    anon_unknown_1::Hunk::FlushEdits((Hunk *)local_e0);
    psVar8 = &hunk.common_;
    while (psVar8 = (size_t *)*psVar8, psVar8 != &hunk.common_) {
      poVar4 = std::operator<<(local_260,*(char *)(psVar8 + 2));
      poVar4 = std::operator<<(poVar4,(char *)psVar8[3]);
      std::operator<<(poVar4,"\n");
    }
    anon_unknown_1::Hunk::~Hunk((Hunk *)local_e0);
  } while( true );
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        std::vector<EditType>::const_iterator it = edits.begin() + edit_i;
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() || (it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}